

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O1

void AstBuilder_build(Builder *builder,Token_conflict *token)

{
  Item *pIVar1;
  AstNode *ast_node;
  
  if (token->matched_type == Token_Comment) {
    ItemQueue_add((ItemQueue *)builder[1].set_error_context,(Item *)token);
    return;
  }
  pIVar1 = ItemQueue_peek((ItemQueue *)builder[1].reset);
  if (pIVar1 != (Item *)0x0) {
    ast_node = (AstNode *)ItemQueue_peek((ItemQueue *)builder[1].reset);
    AstNode_add(ast_node,token->matched_type,token);
    return;
  }
  return;
}

Assistant:

void AstBuilder_build(Builder* builder, Token* token) {
    if ((RuleType)token->matched_type == Rule_Comment) {
        ItemQueue_add(((AstBuilder*)builder)->comments, (Item*)token);
    }
    else if (current_node((AstBuilder*)builder)) {
        AstNode_add(current_node((AstBuilder*)builder), (RuleType)token->matched_type, token);
    }
}